

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void arb1_MxXy(Context *ctx,int x,int y)

{
  int mask;
  char *in_RCX;
  size_t buflen;
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  char src0 [64];
  char row [64];
  char dst [64];
  
  mask = (ctx->dest_arg).writemask;
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,src0,(size_t)in_RCX);
  if (y < 1) {
    y = 0;
  }
  uVar2 = (ulong)(uint)y;
  sVar1 = 0;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    make_ARB1_srcarg_string(ctx,sVar1 + 1,row,(size_t)in_RCX);
    set_dstarg_writemask(&ctx->dest_arg,1 << ((byte)sVar1 & 0x1f));
    make_ARB1_destarg_string(ctx,dst,buflen);
    in_RCX = dst;
    output_line(ctx,"DP%d%s, %s, %s;",(ulong)(uint)x,dst,src0,row);
    sVar1 = sVar1 + 1;
  }
  set_dstarg_writemask(&ctx->dest_arg,mask);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_DS_FUNC(FRC)

static void arb1_MxXy(Context *ctx, const int x, const int y)
{
    DestArgInfo *dstarg = &ctx->dest_arg;
    const int origmask = dstarg->writemask;
    char src0[64];
    int i;

    make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));

    for (i = 0; i < y; i++)
    {
        char dst[64];
        char row[64];
        make_ARB1_srcarg_string(ctx, i + 1, row, sizeof (row));
        set_dstarg_writemask(dstarg, 1 << i);
        make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        output_line(ctx, "DP%d%s, %s, %s;", x, dst, src0, row);
    } // for

    set_dstarg_writemask(dstarg, origmask);
    emit_ARB1_dest_modifiers(ctx);
}